

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O1

tls_object * __thiscall booster::details::pthread_key::get_object(pthread_key *this)

{
  tls_object *__pointer;
  intrusive_ptr<booster::details::key> local_18;
  
  __pointer = (tls_object *)pthread_getspecific(this->key_);
  if (__pointer == (tls_object *)0x0) {
    __pointer = (tls_object *)operator_new(0x10);
    local_18.p_ = &this->super_key;
    atomic_counter::inc(&(this->super_key).super_refcounted.refs_);
    (__pointer->the_key).p_ = local_18.p_;
    if ((pthread_key *)local_18.p_ != (pthread_key *)0x0) {
      atomic_counter::inc(&(((key *)&(local_18.p_)->super_refcounted)->super_refcounted).refs_);
    }
    __pointer->obj = (void *)0x0;
    intrusive_ptr<booster::details::key>::~intrusive_ptr(&local_18);
    pthread_setspecific(this->key_,__pointer);
  }
  return __pointer;
}

Assistant:

tls_object *get_object()
			{
				void *p=pthread_getspecific(key_);
				if(p)
					return static_cast<tls_object*>(p);
				tls_object *res = new tls_object(intrusive_ptr<key>(this));
				pthread_setspecific(key_,static_cast<void*>(res));
				return res;
			}